

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y)

{
  uint uVar1;
  uint uVar2;
  pointer pnVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  pointer pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1a0;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar20 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x0;
  uVar1 = (x->super_IdxSet).num;
  uVar2 = (y->super_IdxSet).num;
  if (0 < (long)(int)uVar2 && 0 < (long)(int)uVar1) {
    lVar15 = (long)(int)uVar1 + -1;
    lVar17 = (long)(int)uVar2 + -1;
    piVar9 = (x->super_IdxSet).idx;
    iVar4 = *piVar9;
    piVar6 = (y->super_IdxSet).idx;
    iVar7 = *piVar6;
    iVar8 = 0;
    iVar16 = (int)lVar17;
    iVar14 = (int)lVar15;
    if (uVar2 < 2 || uVar1 < 2) {
      iVar13 = 0;
    }
    else {
      iVar13 = 0;
      iVar8 = 0;
      do {
        if (iVar4 == iVar7) {
          lVar18 = (long)iVar7;
          pnVar3 = (x->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar18 * 0x80;
          pnVar10 = pnVar3 + lVar18;
          puVar11 = local_a0;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar11 = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
          }
          local_1a0.exp = pnVar3[lVar18].m_backend.exp;
          local_1a0.neg = pnVar3[lVar18].m_backend.neg;
          local_1a0.fpclass = pnVar3[lVar18].m_backend.fpclass;
          local_1a0.prec_elem = pnVar3[lVar18].m_backend.prec_elem;
          pnVar3 = (y->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = pnVar3 + lVar18;
          pcVar12 = &local_120;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
          }
          local_120.exp = pnVar3[lVar18].m_backend.exp;
          local_120.neg = pnVar3[lVar18].m_backend.neg;
          local_120.fpclass = pnVar3[lVar18].m_backend.fpclass;
          local_120.prec_elem = pnVar3[lVar18].m_backend.prec_elem;
          puVar11 = local_a0;
          pcVar12 = &local_1a0;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1a0,&local_120);
          lVar5 = *(long *)(this + 0x20);
          pcVar12 = &local_1a0;
          puVar11 = (uint *)(lVar5 + lVar19);
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar11 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
          }
          *(int *)(lVar5 + 0x70 + lVar19) = local_1a0.exp;
          *(bool *)(lVar5 + 0x74 + lVar19) = local_1a0.neg;
          *(undefined8 *)(lVar5 + 0x78 + lVar19) = local_1a0._120_8_;
          piVar9 = (x->super_IdxSet).idx;
          lVar5 = (long)iVar13;
          iVar13 = iVar13 + 1;
          iVar4 = piVar9[lVar5 + 1];
          piVar6 = (y->super_IdxSet).idx;
LAB_00591c11:
          lVar5 = (long)iVar8;
          iVar8 = iVar8 + 1;
          iVar7 = piVar6[lVar5 + 1];
        }
        else {
          if (iVar7 <= iVar4) goto LAB_00591c11;
          lVar5 = (long)iVar13;
          iVar13 = iVar13 + 1;
          iVar4 = piVar9[lVar5 + 1];
        }
      } while ((iVar13 < iVar14) && (iVar8 < iVar16));
    }
    if ((iVar13 < iVar14) && (iVar4 != iVar7)) {
      lVar5 = (long)iVar13;
      do {
        lVar5 = lVar5 + 1;
        iVar4 = piVar9[lVar5];
        if (lVar15 <= lVar5) break;
      } while (iVar4 != iVar7);
    }
    if ((iVar8 < iVar16) && (iVar4 != iVar7)) {
      lVar15 = (long)iVar8;
      do {
        lVar15 = lVar15 + 1;
        iVar7 = piVar6[lVar15];
        if (lVar17 <= lVar15) break;
      } while (iVar4 != iVar7);
    }
    if (iVar4 == iVar7) {
      lVar17 = (long)iVar4;
      pnVar3 = (x->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar17 * 0x80;
      pnVar10 = pnVar3 + lVar17;
      puVar11 = local_a0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar11 = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
        puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
      }
      local_1a0.exp = pnVar3[lVar17].m_backend.exp;
      local_1a0.neg = pnVar3[lVar17].m_backend.neg;
      local_1a0.fpclass = pnVar3[lVar17].m_backend.fpclass;
      local_1a0.prec_elem = pnVar3[lVar17].m_backend.prec_elem;
      pnVar3 = (y->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = pnVar3 + lVar17;
      pcVar12 = &local_120;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
      }
      local_120.exp = pnVar3[lVar17].m_backend.exp;
      local_120.neg = pnVar3[lVar17].m_backend.neg;
      local_120.fpclass = pnVar3[lVar17].m_backend.fpclass;
      local_120.prec_elem = pnVar3[lVar17].m_backend.prec_elem;
      puVar11 = local_a0;
      pcVar12 = &local_1a0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar11;
        puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1a0,&local_120);
      lVar15 = *(long *)(this + 0x20);
      pcVar12 = &local_1a0;
      puVar11 = (uint *)(lVar15 + lVar5);
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar11 = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
        puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
      }
      *(int *)(lVar15 + 0x70 + lVar5) = local_1a0.exp;
      *(bool *)(lVar15 + 0x74 + lVar5) = local_1a0.neg;
      *(undefined8 *)(lVar15 + 0x78 + lVar5) = local_1a0._120_8_;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}